

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O1

message<MsgType> * __thiscall
blcl::net::tsqueue<blcl::net::message<MsgType>_>::front(tsqueue<blcl::net::message<MsgType>_> *this)

{
  message<MsgType> *pmVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mtx_);
  if (iVar2 == 0) {
    pmVar1 = (this->raw_deque_).
             super__Deque_base<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mtx_);
    return pmVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const T& front() {
            std::scoped_lock lock(queue_mtx_);
            return raw_deque_.front();
        }